

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O3

void __thiscall
glu::FboRenderContext::createFramebuffer(FboRenderContext *this,RenderConfig *config)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  ChannelOrder height;
  IVec4 IVar6;
  int maxSize;
  ChannelOrder local_8c;
  int local_7c;
  RenderTarget local_78;
  deUint32 local_4c;
  PixelFormat local_48;
  TextureFormat local_38;
  long lVar4;
  
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  dVar2 = chooseColorFormat(config);
  local_4c = chooseDepthStencilFormat(config);
  local_8c = config->width;
  height = config->height;
  if ((0 < config->numSamples) && (*(long *)(lVar4 + 0x1240) == 0)) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_78._0_8_ = &local_78.m_pixelFormat.blueBits;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Multisample FBO is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&local_78);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (dVar2 == 0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_78._0_8_ = &local_78.m_pixelFormat.blueBits;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Unsupported color attachment format","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&local_78);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (height == ~R || local_8c == ~R) {
    local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
    (**(code **)(lVar4 + 0x868))(0x84e8,&local_78);
    if (local_8c == ~R) {
      local_8c = local_78.m_width;
    }
    if (height == ~R) {
      height = local_78.m_width;
    }
  }
  local_38 = mapGLInternalFormat(dVar2);
  IVar6 = tcu::getTextureFormatBitDepth((tcu *)&local_78,&local_38);
  local_48.redBits = local_78.m_width;
  local_48.greenBits = local_78.m_height;
  local_48.blueBits = local_78.m_pixelFormat.redBits;
  local_48.alphaBits = local_78.m_pixelFormat.greenBits;
  (**(code **)(lVar4 + 0x6e8))(1,&this->m_colorBuffer,IVar6.m_data._8_8_);
  (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_colorBuffer);
  if (config->numSamples < 1) {
    (**(code **)(lVar4 + 0x1238))(0x8d41,dVar2,local_8c,height);
  }
  else {
    (**(code **)(lVar4 + 0x1240))(0x8d41,config->numSamples,dVar2,local_8c,height);
  }
  iVar1 = 0;
  (**(code **)(lVar4 + 0xa0))(0x8d41,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  checkError(dVar2,"Creating color renderbuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0xfa);
  dVar2 = local_4c;
  local_7c = 0;
  if (local_4c != 0) {
    local_78._0_8_ = mapGLInternalFormat(local_4c);
    local_7c = getNumDepthBits((TextureFormat *)&local_78);
    iVar1 = getNumStencilBits((TextureFormat *)&local_78);
    (**(code **)(lVar4 + 0x6e8))(1,&this->m_depthStencilBuffer);
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_depthStencilBuffer);
    if (config->numSamples < 1) {
      (**(code **)(lVar4 + 0x1238))(0x8d41,dVar2,local_8c,height);
    }
    else {
      (**(code **)(lVar4 + 0x1240))(0x8d41,config->numSamples,dVar2,local_8c,height);
    }
    (**(code **)(lVar4 + 0xa0))(0x8d41,0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    checkError(dVar2,"Creating depth / stencil renderbuffer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
               ,0x10a);
  }
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_framebuffer);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_framebuffer);
  if (this->m_colorBuffer != 0) {
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41);
  }
  if (this->m_depthStencilBuffer != 0) {
    if (0 < local_7c) {
      (**(code **)(lVar4 + 0x688))(0x8d40,0x8d00,0x8d41);
    }
    if (0 < iVar1) {
      (**(code **)(lVar4 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_depthStencilBuffer);
    }
  }
  dVar2 = (**(code **)(lVar4 + 0x800))();
  checkError(dVar2,"Creating framebuffer",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluFboRenderContext.cpp"
             ,0x11c);
  iVar3 = (**(code **)(lVar4 + 0x170))(0x8d40);
  if (iVar3 != 0x8cd5) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_78._0_8_ = &local_78.m_pixelFormat.blueBits;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Framebuffer is not complete","");
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)&local_78);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar4 + 0x1a00))(0,0,local_8c,height);
  tcu::RenderTarget::RenderTarget
            (&local_78,local_8c,height,&local_48,local_7c,iVar1,config->numSamples);
  (this->m_renderTarget).m_numSamples = local_78.m_numSamples;
  (this->m_renderTarget).m_pixelFormat.blueBits = local_78.m_pixelFormat.blueBits;
  (this->m_renderTarget).m_pixelFormat.alphaBits = local_78.m_pixelFormat.alphaBits;
  (this->m_renderTarget).m_depthBits = local_78.m_depthBits;
  (this->m_renderTarget).m_stencilBits = local_78.m_stencilBits;
  (this->m_renderTarget).m_width = local_78.m_width;
  (this->m_renderTarget).m_height = local_78.m_height;
  (this->m_renderTarget).m_pixelFormat.redBits = local_78.m_pixelFormat.redBits;
  (this->m_renderTarget).m_pixelFormat.greenBits = local_78.m_pixelFormat.greenBits;
  return;
}

Assistant:

void FboRenderContext::createFramebuffer (const RenderConfig& config)
{
	DE_ASSERT(m_framebuffer == 0 && m_colorBuffer == 0 && m_depthStencilBuffer == 0);

	const glw::Functions&	gl					= m_context->getFunctions();
	const deUint32			colorFormat			= chooseColorFormat(config);
	const deUint32			depthStencilFormat	= chooseDepthStencilFormat(config);
	int						width				= config.width;
	int						height				= config.height;
	tcu::PixelFormat		pixelFormat;
	int						depthBits			= 0;
	int						stencilBits			= 0;

	if (config.numSamples > 0 && !gl.renderbufferStorageMultisample)
		throw tcu::NotSupportedError("Multisample FBO is not supported");

	if (colorFormat == 0)
		throw tcu::NotSupportedError("Unsupported color attachment format");

	if (width == glu::RenderConfig::DONT_CARE || height == glu::RenderConfig::DONT_CARE)
	{
		int maxSize = 0;
		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &maxSize);

		width	= (width	== glu::RenderConfig::DONT_CARE) ? maxSize : width;
		height	= (height	== glu::RenderConfig::DONT_CARE) ? maxSize : height;
	}

	{
		pixelFormat = getPixelFormat(colorFormat);

		gl.genRenderbuffers(1, &m_colorBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_colorBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, colorFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, colorFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating color renderbuffer");
	}

	if (depthStencilFormat != GL_NONE)
	{
		getDepthStencilBits(depthStencilFormat, &depthBits, &stencilBits);

		gl.genRenderbuffers(1, &m_depthStencilBuffer);
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_depthStencilBuffer);

		if (config.numSamples > 0)
			gl.renderbufferStorageMultisample(GL_RENDERBUFFER, config.numSamples, depthStencilFormat, width, height);
		else
			gl.renderbufferStorage(GL_RENDERBUFFER, depthStencilFormat, width, height);

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Creating depth / stencil renderbuffer");
	}

	gl.genFramebuffers(1, &m_framebuffer);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_colorBuffer)
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);

	if (m_depthStencilBuffer)
	{
		if (depthBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);

		if (stencilBits > 0)
			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_depthStencilBuffer);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Creating framebuffer");

	if (gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Framebuffer is not complete");

	// Set up correct viewport for first test case.
	gl.viewport(0, 0, width, height);

	m_renderTarget = tcu::RenderTarget(width, height, pixelFormat, depthBits, stencilBits, config.numSamples);
}